

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QFontDatabasePrivate::ExtendedScript,QList<QString>>::emplace<QList<QString>const&>
          (QHash<QFontDatabasePrivate::ExtendedScript,QList<QString>> *this,ExtendedScript *key,
          QList<QString> *args)

{
  Data *pDVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> *pDVar3;
  long in_FS_OFFSET;
  piter pVar4;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_004a53e6:
    pDVar3 = *(Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> **)
              this;
    local_38.d = pDVar1;
    if ((pDVar3 == (Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>
                    *)0x0) ||
       (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar3 = QHashPrivate::
               Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
               detached(pDVar3);
      *(Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> **)this =
           pDVar3;
    }
    pVar4 = (piter)emplace_helper<QList<QString>const&>(this,key,args);
    QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::~QHash
              ((QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)&local_38);
  }
  else {
    if (1 < (uint)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) {
      if ((pDVar1 != (Data *)0x0) &&
         ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_004a53e6;
    }
    uVar2._0_4_ = pDVar1[1].super_QArrayData.ref_;
    uVar2._4_4_ = pDVar1[1].super_QArrayData.flags;
    if ((ulong)(pDVar1->super_QArrayData).alloc < uVar2 >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar4 = (piter)emplace_helper<QList<QString>const&>(this,key,args);
        return (iterator)pVar4;
      }
      goto LAB_004a547b;
    }
    local_38.d = (args->d).d;
    local_38.ptr = (args->d).ptr;
    local_38.size = (args->d).size;
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar4 = (piter)emplace_helper<QList<QString>>(this,key,(QList<QString> *)&local_38);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
LAB_004a547b:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }